

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBase<Diligent::EngineVkImplTraits>::ShaderBase
          (ShaderBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,ShaderDesc *Desc,RenderDeviceInfo *DeviceInfo,
          GraphicsAdapterInfo *AdapterInfo,bool bIsDeviceInternal)

{
  long lVar1;
  GraphicsAdapterInfo *pGVar2;
  RAY_TRACING_CAP_FLAGS RVar3;
  SHADER_TYPE SVar4;
  Char *pCVar5;
  char *local_a0;
  RAY_TRACING_CAP_FLAGS RTCaps;
  DeviceFeatures *deviceFeatures;
  allocator local_59;
  ShaderDesc local_58;
  undefined1 local_39;
  GraphicsAdapterInfo *pGStack_38;
  bool bIsDeviceInternal_local;
  GraphicsAdapterInfo *AdapterInfo_local;
  RenderDeviceInfo *DeviceInfo_local;
  ShaderDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  ShaderBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_39 = bIsDeviceInternal;
  pGStack_38 = AdapterInfo;
  AdapterInfo_local = (GraphicsAdapterInfo *)DeviceInfo;
  DeviceInfo_local = (RenderDeviceInfo *)Desc;
  Desc_local = (ShaderDesc *)pDevice;
  pDevice_local = (RenderDeviceImplType *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>).
  super_ObjectBase<Diligent::IShaderVk>.super_RefCountedObject<Diligent::IShaderVk>.super_IShaderVk.
  super_IShader.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_010d4948;
  std::unique_ptr<Diligent::AsyncInitializer,std::default_delete<Diligent::AsyncInitializer>>::
  unique_ptr<std::default_delete<Diligent::AsyncInitializer>,void>
            ((unique_ptr<Diligent::AsyncInitializer,std::default_delete<Diligent::AsyncInitializer>>
              *)&this->m_AsyncInitializer);
  lVar1._0_1_ = (DeviceInfo_local->Features).ComputeShaders;
  lVar1._1_1_ = (DeviceInfo_local->Features).GeometryShaders;
  lVar1._2_1_ = (DeviceInfo_local->Features).Tessellation;
  lVar1._3_1_ = (DeviceInfo_local->Features).MeshShaders;
  lVar1._4_1_ = (DeviceInfo_local->Features).RayTracing;
  lVar1._5_1_ = (DeviceInfo_local->Features).BindlessResources;
  lVar1._6_1_ = (DeviceInfo_local->Features).OcclusionQueries;
  lVar1._7_1_ = (DeviceInfo_local->Features).BinaryOcclusionQueries;
  if (lVar1 == 0) {
    ShaderDesc::ShaderDesc(&local_58);
    local_a0 = local_58.CombinedSamplerSuffix;
  }
  else {
    local_a0 = *(char **)&(DeviceInfo_local->Features).ComputeShaders;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_CombinedSamplerSuffix,local_a0,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::atomic<Diligent::SHADER_STATUS>::atomic(&this->m_Status,SHADER_STATUS_UNINITIALIZED);
  pCVar5 = (Char *)std::__cxx11::string::c_str();
  pGVar2 = AdapterInfo_local;
  (this->
  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>).
  m_Desc.CombinedSamplerSuffix = pCVar5;
  if (((DeviceInfo_local->APIVersion).Minor == 4) && (AdapterInfo_local->Description[0x11] == '\0'))
  {
    LogError<true,char[51]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x81,(char (*) [51])"Geometry shaders are not supported by this device.");
  }
  if ((((DeviceInfo_local->APIVersion).Minor == 0x10) || ((DeviceInfo_local->APIVersion).Minor == 8)
      ) && (pGVar2->Description[0x12] == '\0')) {
    LogError<true,char[55]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x84,(char (*) [55])"Tessellation shaders are not supported by this device.");
  }
  if (((DeviceInfo_local->APIVersion).Minor == 0x20) && (pGVar2->Description[0x10] == '\0')) {
    LogError<true,char[50]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x87,(char (*) [50])"Compute shaders are not supported by this device.");
  }
  if ((((DeviceInfo_local->APIVersion).Minor == 0x40) ||
      ((DeviceInfo_local->APIVersion).Minor == 0x80)) && (pGVar2->Description[0x13] == '\0')) {
    LogError<true,char[47]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x8a,(char (*) [47])"Mesh shaders are not supported by this device.");
  }
  SVar4 = Diligent::operator&((DeviceInfo_local->APIVersion).Minor,SHADER_TYPE_ALL_RAY_TRACING);
  if ((SVar4 != SHADER_TYPE_UNKNOWN) &&
     ((pGVar2->Description[0x14] == '\0' ||
      (RVar3 = Diligent::operator&((pGStack_38->RayTracing).CapFlags,
                                   RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS),
      RVar3 == RAY_TRACING_CAP_FLAG_NONE)))) {
    LogError<true,char[65]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x90,(char (*) [65])
                     "Standalone ray tracing shaders are not supported by this device.");
  }
  if (((DeviceInfo_local->APIVersion).Minor == 0x4000) && (pGVar2->Description[0x31] == '\0')) {
    LogError<true,char[47]>
              (false,"ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x94,(char (*) [47])"Tile shaders are not supported by this device.");
  }
  return;
}

Assistant:

ShaderBase(IReferenceCounters*        pRefCounters,
               RenderDeviceImplType*      pDevice,
               const ShaderDesc&          Desc,
               const RenderDeviceInfo&    DeviceInfo,
               const GraphicsAdapterInfo& AdapterInfo,
               bool                       bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal},
        m_CombinedSamplerSuffix{Desc.CombinedSamplerSuffix != nullptr ? Desc.CombinedSamplerSuffix : ShaderDesc{}.CombinedSamplerSuffix}
    {
        this->m_Desc.CombinedSamplerSuffix = m_CombinedSamplerSuffix.c_str();

        const DeviceFeatures& deviceFeatures = DeviceInfo.Features;
        if (Desc.ShaderType == SHADER_TYPE_GEOMETRY && !deviceFeatures.GeometryShaders)
            LOG_ERROR_AND_THROW("Geometry shaders are not supported by this device.");

        if ((Desc.ShaderType == SHADER_TYPE_DOMAIN || Desc.ShaderType == SHADER_TYPE_HULL) && !deviceFeatures.Tessellation)
            LOG_ERROR_AND_THROW("Tessellation shaders are not supported by this device.");

        if (Desc.ShaderType == SHADER_TYPE_COMPUTE && !deviceFeatures.ComputeShaders)
            LOG_ERROR_AND_THROW("Compute shaders are not supported by this device.");

        if ((Desc.ShaderType == SHADER_TYPE_AMPLIFICATION || Desc.ShaderType == SHADER_TYPE_MESH) && !deviceFeatures.MeshShaders)
            LOG_ERROR_AND_THROW("Mesh shaders are not supported by this device.");

        if ((Desc.ShaderType & SHADER_TYPE_ALL_RAY_TRACING) != 0)
        {
            const RAY_TRACING_CAP_FLAGS RTCaps = AdapterInfo.RayTracing.CapFlags;
            if (!deviceFeatures.RayTracing || (RTCaps & RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS) == 0)
                LOG_ERROR_AND_THROW("Standalone ray tracing shaders are not supported by this device.");
        }

        if (Desc.ShaderType == SHADER_TYPE_TILE && !deviceFeatures.TileShaders)
            LOG_ERROR_AND_THROW("Tile shaders are not supported by this device.");
    }